

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_statistics(roaring_bitmap_t *r,roaring_statistics_t *stat)

{
  uint uVar1;
  int iVar2;
  uint64_t uVar3;
  void **ppvVar4;
  long lVar5;
  uint8_t *puVar6;
  uint8_t uVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  uint8_t uVar11;
  long lVar12;
  run_container_t *run;
  min_max_sum_t mms;
  undefined8 local_40;
  uint64_t local_38;
  
  stat->sum_value = 0;
  stat->cardinality = 0;
  stat->n_bytes_run_containers = 0;
  stat->n_bytes_bitset_containers = 0;
  stat->max_value = 0;
  stat->min_value = 0;
  stat->n_values_array_containers = 0;
  stat->n_values_run_containers = 0;
  stat->n_values_bitset_containers = 0;
  stat->n_bytes_array_containers = 0;
  stat->n_containers = 0;
  stat->n_array_containers = 0;
  stat->n_run_containers = 0;
  stat->n_bitset_containers = 0;
  stat->n_containers = (r->high_low_container).size;
  uVar3 = roaring_bitmap_get_cardinality(r);
  stat->cardinality = uVar3;
  local_40 = 0xffffffff;
  local_38 = 0;
  roaring_iterate(r,min_max_sum_fnc,&local_40);
  stat->max_value = (int)((ulong)local_40 >> 0x20);
  stat->min_value = (int)local_40;
  stat->sum_value = local_38;
  if (0 < (r->high_low_container).size) {
    ppvVar4 = (r->high_low_container).containers;
    puVar6 = (r->high_low_container).typecodes;
    lVar12 = 0;
    do {
      run = (run_container_t *)ppvVar4[lVar12];
      uVar7 = puVar6[lVar12];
      if (uVar7 == '\x04') {
        uVar7 = *(uint8_t *)&run->runs;
        run = *(run_container_t **)run;
      }
      if (uVar7 == '\x03') {
        uVar1 = croaring_hardware_support();
        if ((uVar1 & 2) == 0) {
          uVar1 = croaring_hardware_support();
          if ((uVar1 & 1) == 0) {
            iVar2 = run->n_runs;
            lVar5 = (long)iVar2;
            if (0 < lVar5) {
              lVar10 = 0;
              do {
                iVar2 = iVar2 + (uint)run->runs[lVar10].length;
                lVar10 = lVar10 + 1;
              } while (lVar5 != lVar10);
            }
          }
          else {
            iVar2 = _avx2_run_container_cardinality(run);
          }
        }
        else {
          iVar2 = _avx512_run_container_cardinality(run);
        }
      }
      else {
        iVar2 = run->n_runs;
      }
      ppvVar4 = (r->high_low_container).containers;
      puVar6 = (r->high_low_container).typecodes;
      piVar9 = (int *)ppvVar4[lVar12];
      uVar11 = puVar6[lVar12];
      if (uVar11 == '\x04') {
        uVar11 = (uint8_t)piVar9[2];
        piVar9 = *(int **)piVar9;
      }
      if (uVar11 == '\x01') {
        iVar8 = 0x2000;
      }
      else if (uVar11 == '\x03') {
        iVar8 = *piVar9 * 4 + 2;
      }
      else {
        iVar8 = *piVar9 * 2;
      }
      if (uVar7 == '\x03') {
        stat->n_run_containers = stat->n_run_containers + 1;
        stat->n_values_run_containers = stat->n_values_run_containers + iVar2;
        stat->n_bytes_run_containers = stat->n_bytes_run_containers + iVar8;
      }
      else if (uVar7 == '\x02') {
        stat->n_array_containers = stat->n_array_containers + 1;
        stat->n_values_array_containers = stat->n_values_array_containers + iVar2;
        stat->n_bytes_array_containers = stat->n_bytes_array_containers + iVar8;
      }
      else {
        stat->n_bitset_containers = stat->n_bitset_containers + 1;
        stat->n_values_bitset_containers = stat->n_values_bitset_containers + iVar2;
        stat->n_bytes_bitset_containers = stat->n_bytes_bitset_containers + iVar8;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (r->high_low_container).size);
  }
  return;
}

Assistant:

void roaring_bitmap_statistics(const roaring_bitmap_t *r,
                               roaring_statistics_t *stat) {
    const roaring_array_t *ra = &r->high_low_container;

    memset(stat, 0, sizeof(*stat));
    stat->n_containers = ra->size;
    stat->cardinality = roaring_bitmap_get_cardinality(r);
    min_max_sum_t mms;
    mms.min = UINT32_C(0xFFFFFFFF);
    mms.max = UINT32_C(0);
    mms.sum = 0;
    roaring_iterate(r, &min_max_sum_fnc, &mms);
    stat->min_value = mms.min;
    stat->max_value = mms.max;
    stat->sum_value = mms.sum;

    for (int i = 0; i < ra->size; ++i) {
        uint8_t truetype =
            get_container_type(ra->containers[i], ra->typecodes[i]);
        uint32_t card =
            container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        uint32_t sbytes =
            container_size_in_bytes(ra->containers[i], ra->typecodes[i]);
        switch (truetype) {
            case BITSET_CONTAINER_TYPE:
                stat->n_bitset_containers++;
                stat->n_values_bitset_containers += card;
                stat->n_bytes_bitset_containers += sbytes;
                break;
            case ARRAY_CONTAINER_TYPE:
                stat->n_array_containers++;
                stat->n_values_array_containers += card;
                stat->n_bytes_array_containers += sbytes;
                break;
            case RUN_CONTAINER_TYPE:
                stat->n_run_containers++;
                stat->n_values_run_containers += card;
                stat->n_bytes_run_containers += sbytes;
                break;
            default:
                assert(false);
                roaring_unreachable;
        }
    }
}